

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O3

Filter * __thiscall
helics::ConnectorFederateManager::getFilter(ConnectorFederateManager *this,string_view name)

{
  bool bVar1;
  int iVar2;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar3;
  long lVar4;
  pthread_rwlock_t *__rwlock;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar5;
  int iVar6;
  undefined1 *puVar7;
  BlockIterator<const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_*const_*>
  filt;
  BlockIterator<const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_const_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_*const_*>
  local_48;
  
  bVar1 = (this->filters).enabled;
  if (bVar1 == true) {
    __rwlock = (pthread_rwlock_t *)&(this->filters).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  else {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  gmlc::containers::
  StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
  ::find(&local_48,&(this->filters).m_obj,name);
  iVar2 = (this->filters).m_obj.dataStorage.bsize;
  ppuVar3 = (this->filters).m_obj.dataStorage.dataptr;
  lVar4 = (long)(this->filters).m_obj.dataStorage.dataSlotIndex;
  if (ppuVar3 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
    ppuVar5 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
              &gmlc::containers::
               StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
               ::end()::emptyValue;
  }
  else {
    ppuVar5 = ppuVar3 + lVar4 + 1;
  }
  ppuVar3 = ppuVar3 + lVar4;
  if (iVar2 == 0x20) {
    ppuVar3 = ppuVar5;
  }
  iVar6 = 0;
  if (iVar2 != 0x20) {
    iVar6 = iVar2;
  }
  if ((local_48.offset == iVar6) && (local_48.vec == ppuVar3)) {
    puVar7 = invalidFilt;
  }
  else {
    puVar7 = (undefined1 *)
             ((local_48.ptr)->_M_t).
             super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
             super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
             super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  return (Filter *)puVar7;
}

Assistant:

const Filter& ConnectorFederateManager::getFilter(std::string_view name) const
{
    auto sharedFilt = filters.lock_shared();
    auto filt = sharedFilt->find(name);
    return (filt != sharedFilt.end()) ? (**filt) : invalidFilt;
}